

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O0

void Cec_ManSatPrintStats(Cec_ManSat_t *p)

{
  uint uVar1;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  Cec_ManSat_t *p_local;
  
  uVar1 = Gia_ManCoNum(p->pAig);
  Abc_Print(1,"CO = %8d  ",(ulong)uVar1);
  uVar1 = Gia_ManAndNum(p->pAig);
  Abc_Print(1,"AND = %8d  ",(ulong)uVar1);
  Abc_Print(1,"Conf = %5d  ",(ulong)(uint)p->pPars->nBTLimit);
  Abc_Print(1,"MinVar = %5d  ",(ulong)(uint)p->pPars->nSatVarMax);
  Abc_Print(1,"MinCalls = %5d\n",(ulong)(uint)p->pPars->nCallsRecycle);
  if (p->nSatTotal == 0) {
    local_20 = 0.0;
  }
  else {
    local_20 = ((double)p->nSatUnsat * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUnsat == 0) {
    local_30 = 0.0;
  }
  else {
    local_30 = ((double)p->nConfUnsat * 1.0) / (double)p->nSatUnsat;
  }
  Abc_Print(1,"Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_20,local_30,
            (ulong)(uint)p->nSatUnsat);
  Abc_PrintTimeP(1,"Time",(long)p->timeSatUnsat,(long)p->timeTotal);
  if (p->nSatTotal == 0) {
    local_40 = 0.0;
  }
  else {
    local_40 = ((double)p->nSatSat * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatSat == 0) {
    local_50 = 0.0;
  }
  else {
    local_50 = ((double)p->nConfSat * 1.0) / (double)p->nSatSat;
  }
  Abc_Print(1,"Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_40,local_50,
            (ulong)(uint)p->nSatSat);
  Abc_PrintTimeP(1,"Time",(long)p->timeSatSat,(long)p->timeTotal);
  if (p->nSatTotal == 0) {
    local_60 = 0.0;
  }
  else {
    local_60 = ((double)p->nSatUndec * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUndec == 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = ((double)p->nConfUndec * 1.0) / (double)p->nSatUndec;
  }
  Abc_Print(1,"Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_60,local_70,
            (ulong)(uint)p->nSatUndec);
  Abc_PrintTimeP(1,"Time",(long)p->timeSatUndec,(long)p->timeTotal);
  Abc_PrintTime(1,"Total time",(long)p->timeTotal);
  return;
}

Assistant:

void Cec_ManSatPrintStats( Cec_ManSat_t * p )
{
    Abc_Print( 1, "CO = %8d  ", Gia_ManCoNum(p->pAig) );
    Abc_Print( 1, "AND = %8d  ", Gia_ManAndNum(p->pAig) );
    Abc_Print( 1, "Conf = %5d  ", p->pPars->nBTLimit );
    Abc_Print( 1, "MinVar = %5d  ", p->pPars->nSatVarMax );
    Abc_Print( 1, "MinCalls = %5d\n", p->pPars->nCallsRecycle );
    Abc_Print( 1, "Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUnsat, p->nSatTotal? 100.0*p->nSatUnsat/p->nSatTotal : 0.0, p->nSatUnsat? 1.0*p->nConfUnsat/p->nSatUnsat :0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUnsat, p->timeTotal );
    Abc_Print( 1, "Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatSat,   p->nSatTotal? 100.0*p->nSatSat/p->nSatTotal : 0.0,   p->nSatSat? 1.0*p->nConfSat/p->nSatSat : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatSat,   p->timeTotal );
    Abc_Print( 1, "Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUndec, p->nSatTotal? 100.0*p->nSatUndec/p->nSatTotal : 0.0, p->nSatUndec? 1.0*p->nConfUndec/p->nSatUndec : 0.0 );
    Abc_PrintTimeP( 1, "Time", p->timeSatUndec, p->timeTotal );
    Abc_PrintTime( 1, "Total time", p->timeTotal );
}